

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *pcVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar8;
  Amount AVar9;
  AssertionResult gtest_ar_4;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar;
  CfdException *except;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  ConfidentialTransactionContext txc;
  Amount fee;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  double fee_rate;
  ElementsConfidentialAddress reserve_ct_addr4;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ExtPubkey key;
  Address address4;
  Address address3;
  Address address2;
  Address address1;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  ConfidentialAssetId *in_stack_ffffffffffffbca8;
  AbstractTransactionController *this_00;
  UtxoData *in_stack_ffffffffffffbcb0;
  UtxoData *this_01;
  undefined4 in_stack_ffffffffffffbcb8;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffbcbc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffbcc0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  allocator_type *in_stack_ffffffffffffbcd8;
  string *tx_hex;
  undefined4 in_stack_ffffffffffffbce0;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffbce4;
  undefined4 in_stack_ffffffffffffbce8;
  undefined4 uVar12;
  NetType in_stack_ffffffffffffbcec;
  undefined4 uVar13;
  ElementsAddressFactory *in_stack_ffffffffffffbcf0;
  ConfidentialTransactionContext *this_03;
  undefined7 in_stack_ffffffffffffbd20;
  undefined1 in_stack_ffffffffffffbd27;
  UtxoData *in_stack_ffffffffffffbd28;
  undefined7 in_stack_ffffffffffffbd30;
  undefined1 in_stack_ffffffffffffbd37;
  undefined4 in_stack_ffffffffffffbd58;
  undefined1 in_stack_ffffffffffffbd5c;
  undefined1 in_stack_ffffffffffffbd5e;
  ConfidentialTransactionContext *in_stack_ffffffffffffbd60;
  undefined8 in_stack_ffffffffffffbd80;
  allocator *paVar14;
  undefined2 in_stack_ffffffffffffbd88;
  undefined1 in_stack_ffffffffffffbd8a;
  undefined1 in_stack_ffffffffffffbd8b;
  undefined1 in_stack_ffffffffffffbd8c;
  undefined1 in_stack_ffffffffffffbd8d;
  undefined1 in_stack_ffffffffffffbd8e;
  undefined1 in_stack_ffffffffffffbd8f;
  Amount *in_stack_ffffffffffffbd90;
  ElementsConfidentialAddress *in_stack_ffffffffffffbd98;
  undefined4 in_stack_ffffffffffffbda0;
  undefined1 in_stack_ffffffffffffbda4;
  undefined1 in_stack_ffffffffffffbda5;
  undefined1 in_stack_ffffffffffffbda6;
  undefined1 in_stack_ffffffffffffbda7;
  undefined8 ****local_41b0;
  AssertHelper local_4130;
  Message local_4128;
  undefined4 local_411c;
  AssertionResult local_4118;
  uint local_4104;
  AssertHelper local_4100;
  Message local_40f8;
  undefined4 local_40f0;
  uint32_t local_40ec;
  AssertionResult local_40e8;
  AssertHelper local_40d8;
  Message local_40d0;
  string local_40c8;
  AssertionResult local_40a8;
  AssertHelper local_4098;
  Message local_4090;
  int64_t local_4088;
  int64_t local_4080;
  undefined1 local_4078;
  Amount local_4070;
  int64_t local_4060;
  AssertionResult local_4058;
  AssertHelper local_4048;
  Message local_4040;
  ByteData local_4038;
  AssertHelper local_4020;
  Message local_4018 [5];
  CoinSelectionOption *in_stack_ffffffffffffc010;
  AssertHelper local_3fe8;
  Message local_3fe0;
  SigHashType local_3fd8;
  undefined1 local_3fc9 [105];
  Pubkey local_3f60;
  OutPoint local_3f48;
  AssertHelper local_3f20;
  Message local_3f18 [2];
  ByteData local_3f08;
  byte local_3ee9;
  ConstCharPtr local_3ee8;
  AssertHelper local_3ee0;
  Message local_3ed8;
  OutPoint local_3ed0;
  AssertHelper local_3ea8;
  Message local_3ea0;
  SigHashType local_3e98;
  allocator local_3e89;
  string local_3e88;
  Privkey local_3e68;
  allocator local_3e41;
  string local_3e40;
  Pubkey local_3e20;
  OutPoint local_3e08;
  AssertHelper local_3de0;
  Message local_3dd8 [2];
  ByteData local_3dc8;
  byte local_3da9;
  ConstCharPtr local_3da8;
  AssertHelper local_3da0;
  Message local_3d98 [4];
  undefined7 in_stack_ffffffffffffc288;
  undefined1 in_stack_ffffffffffffc28f;
  ConfidentialTransactionContext *in_stack_ffffffffffffc290;
  AssertHelper in_stack_ffffffffffffc298;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffc2a0;
  OutPoint *in_stack_ffffffffffffc2a8;
  ConfidentialTransactionContext *in_stack_ffffffffffffc2b0;
  string local_3d48 [8];
  ByteData256 *in_stack_ffffffffffffc2c0;
  undefined8 in_stack_ffffffffffffc2c8;
  Privkey local_3d28;
  allocator local_3d01;
  string local_3d00;
  Pubkey local_3ce0;
  OutPoint local_3cc8;
  ByteData local_3ca0;
  AssertHelper local_3c88;
  Message local_3c80;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffc388;
  ConfidentialTransactionContext *in_stack_ffffffffffffc390;
  string local_3c48 [248];
  string local_3b50 [3];
  ElementsTransactionApi local_3ad9;
  Amount local_3ad8;
  int64_t local_3ac8;
  undefined1 local_3ac0;
  int64_t local_3ab8;
  undefined1 local_3ab0;
  ConfidentialTransaction local_3aa8 [3];
  Amount local_39d0;
  CoinSelectionOption local_39c0;
  string local_3958;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_3938;
  _Base_ptr local_3910;
  undefined1 local_3908;
  string local_3900;
  string local_38e0;
  _Base_ptr local_38c0;
  undefined1 local_38b8;
  string local_38b0;
  string local_3890;
  AbstractTransactionController local_3870 [3];
  _Base_ptr local_3840;
  undefined1 local_3838;
  Amount local_3830;
  string local_3820;
  _Base_ptr local_3800;
  undefined1 local_37f8;
  Amount local_37f0;
  string local_37e0 [2];
  undefined1 local_3790 [192];
  Pubkey local_36d0;
  ElementsConfidentialAddress local_36b8;
  Extkey local_3500;
  Pubkey local_3470;
  ElementsConfidentialAddress local_3458;
  Extkey local_32a0;
  Pubkey local_3210;
  ElementsConfidentialAddress local_31f8;
  pointer in_stack_ffffffffffffd010;
  undefined1 in_stack_ffffffffffffd01f;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_ffffffffffffd020;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *in_stack_ffffffffffffd028;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd030;
  string *in_stack_ffffffffffffd038;
  ElementsTransactionApi *in_stack_ffffffffffffd040;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffd060;
  ConfidentialAssetId *in_stack_ffffffffffffd068;
  Amount *in_stack_ffffffffffffd078;
  UtxoFilter *in_stack_ffffffffffffd080;
  undefined8 in_stack_ffffffffffffd088;
  undefined8 in_stack_ffffffffffffd090;
  NetType_conflict in_stack_ffffffffffffd098;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_ffffffffffffd0a0;
  Amount *in_stack_ffffffffffffd0a8;
  undefined8 ***local_2dd0 [495];
  undefined1 ****local_1e58;
  undefined8 local_1e50;
  allocator local_1e29;
  string local_1e28;
  ExtPubkey local_1e08;
  allocator local_1d71;
  string local_1d70 [32];
  Address local_1d50;
  allocator local_1bc9;
  string local_1bc8 [32];
  Address local_1ba8;
  allocator local_1a21;
  string local_1a20 [32];
  Address local_1a00;
  allocator local_1879;
  string local_1878 [32];
  Address local_1858;
  Amount local_16d8;
  allocator local_16c1;
  string local_16c0 [32];
  Address local_16a0;
  allocator local_1519;
  string local_1518;
  Script local_14f8;
  allocator local_14b9;
  string local_14b8;
  Txid local_1498;
  undefined8 local_1478;
  Txid local_1450;
  uint32_t local_1430;
  Script local_1428 [2];
  Address local_13b8;
  string local_1238 [32];
  Amount local_1218;
  undefined4 local_1208;
  undefined8 local_1200;
  ConfidentialAssetId local_11f8 [17];
  Amount local_f50;
  allocator local_f39;
  string local_f38 [32];
  Address local_f18;
  allocator local_d91;
  string local_d90;
  Script local_d70;
  allocator local_d31;
  string local_d30;
  Txid local_d10;
  undefined8 local_cf0;
  Txid local_cc8;
  uint32_t local_ca8;
  Script local_ca0 [2];
  Address local_c30;
  string local_ab0 [32];
  int64_t local_a90;
  undefined1 local_a88;
  undefined4 local_a80;
  undefined8 local_a78;
  ConfidentialAssetId local_a70 [17];
  Amount local_7c8;
  allocator local_7b1;
  string local_7b0 [32];
  Address local_790;
  allocator local_609;
  string local_608;
  Script local_5e8;
  allocator local_5a9;
  string local_5a8;
  Txid local_588;
  undefined8 local_558;
  Txid local_530;
  uint32_t local_510;
  Script local_508 [2];
  Address local_498;
  string local_318 [32];
  int64_t local_2f8;
  undefined1 local_2f0;
  undefined4 local_2e8;
  undefined8 local_2e0;
  ConfidentialAssetId local_2d8 [18];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_ffffffffffffbcf0,in_stack_ffffffffffffbcec);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffbd27,in_stack_ffffffffffffbd20))
  ;
  local_558 = 0;
  local_2e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_5a9);
  cfd::core::Txid::Txid(&local_588,&local_5a8);
  cfd::core::Txid::operator=(&local_530,&local_588);
  cfd::core::Txid::~Txid((Txid *)0x2df6f6);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  local_510 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_609);
  cfd::core::Script::Script(&local_5e8,&local_608);
  cfd::core::Script::operator=(local_508,&local_5e8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_7b1);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
             (string *)in_stack_ffffffffffffbcb0);
  cfd::core::Address::operator=(&local_498,&local_790);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::__cxx11::string::operator=
            (local_318,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_7c8,2000000000000000);
  local_2f0 = local_7c8.ignore_check_;
  local_2f8 = local_7c8.amount_;
  local_2e8 = 2;
  cfd::core::ConfidentialAssetId::operator=(local_2d8,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffbd27,in_stack_ffffffffffffbd20))
  ;
  local_cf0 = 0;
  local_a78 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d30,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_d31);
  cfd::core::Txid::Txid(&local_d10,&local_d30);
  cfd::core::Txid::operator=(&local_cc8,&local_d10);
  cfd::core::Txid::~Txid((Txid *)0x2df936);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  local_ca8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d90,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d91);
  cfd::core::Script::Script(&local_d70,&local_d90);
  cfd::core::Script::operator=(local_ca0,&local_d70);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string((string *)&local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f38,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",&local_f39);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
             (string *)in_stack_ffffffffffffbcb0);
  cfd::core::Address::operator=(&local_c30,&local_f18);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  std::__cxx11::string::operator=
            (local_ab0,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_f50,2000000000000000);
  local_a88 = local_f50.ignore_check_;
  local_a90 = local_f50.amount_;
  local_a80 = 6;
  cfd::core::ConfidentialAssetId::operator=(local_a70,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffbd27,in_stack_ffffffffffffbd20))
  ;
  local_1478 = 0;
  local_1200 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_14b8,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_14b9);
  cfd::core::Txid::Txid(&local_1498,&local_14b8);
  cfd::core::Txid::operator=(&local_1450,&local_1498);
  cfd::core::Txid::~Txid((Txid *)0x2dfb76);
  std::__cxx11::string::~string((string *)&local_14b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b9);
  local_1430 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1518,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_1519);
  cfd::core::Script::Script(&local_14f8,&local_1518);
  cfd::core::Script::operator=(local_1428,&local_14f8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string((string *)&local_1518);
  std::allocator<char>::~allocator((allocator<char> *)&local_1519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16c0,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_16c1)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
             (string *)in_stack_ffffffffffffbcb0);
  cfd::core::Address::operator=(&local_13b8,&local_16a0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string(local_16c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16c1);
  std::__cxx11::string::operator=
            (local_1238,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_16d8,50000000000000);
  local_1218.ignore_check_ = local_16d8.ignore_check_;
  local_1218.amount_ = local_16d8.amount_;
  local_1208 = 4;
  cfd::core::ConfidentialAssetId::operator=(local_11f8,&exp_dummy_asset_a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1878,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_1879);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
             (string *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string(local_1878);
  std::allocator<char>::~allocator((allocator<char> *)&local_1879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a20,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu",&local_1a21)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
             (string *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string(local_1a20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bc8,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_1bc9)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
             (string *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string(local_1bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d70,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu",&local_1d71)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
             (string *)in_stack_ffffffffffffbcb0);
  std::__cxx11::string::~string(local_1d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e28,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,&local_1e29);
  cfd::core::ExtPubkey::ExtPubkey(&local_1e08,&local_1e28);
  std::__cxx11::string::~string((string *)&local_1e28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e29);
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffbd37,in_stack_ffffffffffffbd30),
             in_stack_ffffffffffffbd28);
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffbd37,in_stack_ffffffffffffbd30),
             in_stack_ffffffffffffbd28);
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffbd37,in_stack_ffffffffffffbd30),
             in_stack_ffffffffffffbd28);
  local_1e58 = (undefined1 ****)local_2dd0;
  local_1e50 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2dffc3);
  __l._M_array._4_4_ = in_stack_ffffffffffffbcec;
  __l._M_array._0_4_ = in_stack_ffffffffffffbce8;
  __l._M_len = (size_type)in_stack_ffffffffffffbcf0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             CONCAT44(in_stack_ffffffffffffbce4,in_stack_ffffffffffffbce0),__l,
             in_stack_ffffffffffffbcd8);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2dfff7);
  local_41b0 = &local_1e58;
  do {
    local_41b0 = local_41b0 + -0xa5;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffbcb0);
    uVar2 = (undefined1)((ulong)in_stack_ffffffffffffbd80 >> 0x38);
  } while (local_41b0 != local_2dd0);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&stack0xffffffffffffcfc0,&local_1e08,0x5b);
  cfd::core::Extkey::GetPubkey
            ((Pubkey *)&stack0xffffffffffffd050,(Extkey *)&stack0xffffffffffffcfc0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&stack0xffffffffffffd068,&local_1858,
             (ConfidentialKey *)&stack0xffffffffffffd050);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e00ad);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e00ba);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_32a0,&local_1e08,0x5c);
  cfd::core::Extkey::GetPubkey(&local_3210,&local_32a0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_31f8,&local_1a00,&local_3210);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e0119);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e0126);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_3500,&local_1e08,0x5d);
  cfd::core::Extkey::GetPubkey(&local_3470,&local_3500);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_3458,&local_1ba8,&local_3470);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e0185);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e0192);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)(local_3790 + 0x30),&local_1e08,0x5e);
  cfd::core::Extkey::GetPubkey(&local_36d0,(Extkey *)(local_3790 + 0x30));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_36b8,&local_1d50,&local_36d0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e01f1);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e01fe);
  local_3790._40_8_ = (_func_int **)0x3fbc28f5c28f5c29;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_3790,&exp_dummy_asset_a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x2e0233);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_37e0,&exp_dummy_asset_a);
  cfd::core::Amount::Amount(&local_37f0);
  pVar7 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffbcc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
                     (Amount *)in_stack_ffffffffffffbcb0);
  local_3800 = (_Base_ptr)pVar7.first._M_node;
  local_37f8 = pVar7.second;
  std::__cxx11::string::~string((string *)local_37e0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3820,&exp_dummy_asset_b);
  cfd::core::Amount::Amount(&local_3830);
  pVar7 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffbcc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
                     (Amount *)in_stack_ffffffffffffbcb0);
  local_3840 = (_Base_ptr)pVar7.first._M_node;
  local_3838 = pVar7.second;
  std::__cxx11::string::~string((string *)&local_3820);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2e033c);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3890,&exp_dummy_asset_a);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_38b0,&local_3458);
  pVar8 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_ffffffffffffbcc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbcb0);
  local_38c0 = (_Base_ptr)pVar8.first._M_node;
  local_38b8 = pVar8.second;
  std::__cxx11::string::~string((string *)&local_38b0);
  std::__cxx11::string::~string((string *)&local_3890);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_38e0,&exp_dummy_asset_b);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_3900,&local_36b8);
  pVar8 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_ffffffffffffbcc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffbcbc,in_stack_ffffffffffffbcb8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbcb0);
  local_3910 = (_Base_ptr)pVar8.first._M_node;
  local_3908 = pVar8.second;
  std::__cxx11::string::~string((string *)&local_3900);
  std::__cxx11::string::~string((string *)&local_38e0);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x2e046f);
  cfd::core::Amount::Amount((Amount *)&local_3938);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2e048b);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_ffffffffffffbcb0);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_ffffffffffffc010);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffbcb0,(double)in_stack_ffffffffffffbca8);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffbcb0,(double)in_stack_ffffffffffffbca8);
  cfd::CoinSelectionOption::SetFeeAsset
            ((CoinSelectionOption *)in_stack_ffffffffffffbcb0,in_stack_ffffffffffffbca8);
  cfd::CoinSelectionOption::SetBlindInfo(&local_39c0,0,0x34);
  cfd::core::Amount::Amount(&local_39d0,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffbce4,in_stack_ffffffffffffbce0),
             (uint32_t)((ulong)in_stack_ffffffffffffbcd8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffbcd8);
  AVar9 = cfd::core::operator-(&local_1218,&local_39d0);
  local_3ac8 = AVar9.amount_;
  local_3ac0 = AVar9.ignore_check_;
  local_3ab8 = local_3ac8;
  local_3ab0 = local_3ac0;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_ffffffffffffbda7,
                      CONCAT16(in_stack_ffffffffffffbda6,
                               CONCAT15(in_stack_ffffffffffffbda5,
                                        CONCAT14(in_stack_ffffffffffffbda4,in_stack_ffffffffffffbda0
                                                )))),in_stack_ffffffffffffbd98,
             in_stack_ffffffffffffbd90,
             (ConfidentialAssetId *)
             CONCAT17(in_stack_ffffffffffffbd8f,
                      CONCAT16(in_stack_ffffffffffffbd8e,
                               CONCAT15(in_stack_ffffffffffffbd8d,
                                        CONCAT14(in_stack_ffffffffffffbd8c,
                                                 CONCAT13(in_stack_ffffffffffffbd8b,
                                                          CONCAT12(in_stack_ffffffffffffbd8a,
                                                                   in_stack_ffffffffffffbd88)))))),
             (bool)uVar2);
  cfd::core::Amount::Amount(&local_3ad8,2100000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_ffffffffffffbda7,
                      CONCAT16(in_stack_ffffffffffffbda6,
                               CONCAT15(in_stack_ffffffffffffbda5,
                                        CONCAT14(in_stack_ffffffffffffbda4,in_stack_ffffffffffffbda0
                                                )))),in_stack_ffffffffffffbd98,
             in_stack_ffffffffffffbd90,
             (ConfidentialAssetId *)
             CONCAT17(in_stack_ffffffffffffbd8f,
                      CONCAT16(in_stack_ffffffffffffbd8e,
                               CONCAT15(in_stack_ffffffffffffbd8d,
                                        CONCAT14(in_stack_ffffffffffffbd8c,
                                                 CONCAT13(in_stack_ffffffffffffbd8b,
                                                          CONCAT12(in_stack_ffffffffffffbd8a,
                                                                   in_stack_ffffffffffffbd88)))))),
             (bool)uVar2);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_3ad9);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (local_3b50,&local_3aa8[0].super_AbstractTransaction);
  tx_hex = &local_3958;
  pcVar6 = (char *)((long)&local_3958.field_2 + 0xc);
  this_02 = &local_3938;
  this_01 = (UtxoData *)local_3790;
  this_00 = local_3870;
  this_03 = (ConfidentialTransactionContext *)0x0;
  uVar12 = 0;
  uVar13 = 0;
  uVar11 = 4;
  uVar10 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (in_stack_ffffffffffffd040,in_stack_ffffffffffffd038,in_stack_ffffffffffffd030,
             in_stack_ffffffffffffd028,in_stack_ffffffffffffd020,in_stack_ffffffffffffd060,
             in_stack_ffffffffffffd068,(bool)in_stack_ffffffffffffd01f,
             (double)in_stack_ffffffffffffd010,in_stack_ffffffffffffd078,in_stack_ffffffffffffd080,
             (CoinSelectionOption *)in_stack_ffffffffffffd088,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffd090,in_stack_ffffffffffffd098,in_stack_ffffffffffffd0a0,
             in_stack_ffffffffffffd0a8);
  std::__cxx11::string::~string((string *)local_3b50);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_(this_00);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffbce4,uVar11),tx_hex);
  cfd::ConfidentialTransactionContext::operator=
            (this_03,(ConfidentialTransactionContext *)CONCAT44(uVar13,uVar12));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  std::__cxx11::string::~string(local_3c48);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_01);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffc390,in_stack_ffffffffffffc388);
    }
  }
  else {
    testing::Message::Message(&local_3c80);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4b9,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3c88,&local_3c80);
    testing::internal::AssertHelper::~AssertHelper(&local_3c88);
    testing::Message::~Message((Message *)0x2e1498);
  }
  cfd::core::ByteData::ByteData(&local_3ca0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3cc8,&local_530,local_510);
      paVar14 = &local_3d01;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3d00,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",paVar14);
      cfd::core::Pubkey::Pubkey(&local_3ce0,&local_3d00);
      paVar14 = (allocator *)&stack0xffffffffffffc2b7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3d48,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",paVar14);
      cfd::core::Privkey::FromWif(&local_3d28,(string *)local_3d48,kTestnet,true);
      cfd::core::SigHashType::SigHashType((SigHashType *)&stack0xffffffffffffc2a8);
      this_01 = (UtxoData *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                (in_stack_ffffffffffffc2b0,in_stack_ffffffffffffc2a8,
                 (Pubkey *)in_stack_ffffffffffffc2a0.ptr_,(Privkey *)in_stack_ffffffffffffc298.data_
                 ,(SigHashType *)in_stack_ffffffffffffc290,(bool)in_stack_ffffffffffffc28f,
                 in_stack_ffffffffffffc2c0,(ByteData *)in_stack_ffffffffffffc2c8);
      cfd::core::Privkey::~Privkey((Privkey *)0x2e164a);
      std::__cxx11::string::~string(local_3d48);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffc2b7);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e1671);
      std::__cxx11::string::~string((string *)&local_3d00);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d01);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2e1698);
    }
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffc2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffc298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c0,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffc298,(Message *)&stack0xffffffffffffc2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffc298);
    testing::Message::~Message((Message *)0x2e182a);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)(local_3d98 + 1),&local_530,local_510);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc290,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffc28f,in_stack_ffffffffffffc288));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2e18f3);
    }
  }
  else {
    testing::Message::Message(local_3d98);
    testing::internal::AssertHelper::AssertHelper
              (&local_3da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c1,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3da0,local_3d98);
    testing::internal::AssertHelper::~AssertHelper(&local_3da0);
    testing::Message::~Message((Message *)0x2e19bd);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_3da8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_3da8);
  if (bVar1) {
    local_3da9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffbcbc,uVar10));
      cfd::core::ByteData::operator=(&local_3ca0,&local_3dc8);
      cfd::core::ByteData::~ByteData((ByteData *)0x2e1aa5);
    }
    if ((local_3da9 & 1) == 0) {
      local_3da8.value =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002e1b6b;
    }
  }
  else {
LAB_002e1b6b:
    testing::Message::Message(local_3dd8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3de0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c2,local_3da8.value);
    testing::internal::AssertHelper::operator=(&local_3de0,local_3dd8);
    testing::internal::AssertHelper::~AssertHelper(&local_3de0);
    testing::Message::~Message((Message *)0x2e1bd3);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3e08,&local_cc8,local_ca8);
      paVar14 = &local_3e41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3e40,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",paVar14);
      cfd::core::Pubkey::Pubkey(&local_3e20,&local_3e40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3e88,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_3e89);
      cfd::core::Privkey::FromWif(&local_3e68,&local_3e88,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_3e98);
      this_01 = (UtxoData *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                (in_stack_ffffffffffffc2b0,in_stack_ffffffffffffc2a8,
                 (Pubkey *)in_stack_ffffffffffffc2a0.ptr_,(Privkey *)in_stack_ffffffffffffc298.data_
                 ,(SigHashType *)in_stack_ffffffffffffc290,(bool)in_stack_ffffffffffffc28f,
                 in_stack_ffffffffffffc2c0,(ByteData *)in_stack_ffffffffffffc2c8);
      cfd::core::Privkey::~Privkey((Privkey *)0x2e1d76);
      std::__cxx11::string::~string((string *)&local_3e88);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e89);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e1d9d);
      std::__cxx11::string::~string((string *)&local_3e40);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e41);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2e1dc4);
    }
  }
  else {
    testing::Message::Message(&local_3ea0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c7,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3ea8,&local_3ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_3ea8);
    testing::Message::~Message((Message *)0x2e1f3d);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3ed0,&local_cc8,local_ca8);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc290,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffc28f,in_stack_ffffffffffffc288));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2e2006);
    }
  }
  else {
    testing::Message::Message(&local_3ed8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3ee0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c8,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3ee0,&local_3ed8);
    testing::internal::AssertHelper::~AssertHelper(&local_3ee0);
    testing::Message::~Message((Message *)0x2e20d0);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_3ee8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_3ee8);
  if (bVar1) {
    local_3ee9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffbcbc,uVar10));
      cfd::core::ByteData::operator=(&local_3ca0,&local_3f08);
      cfd::core::ByteData::~ByteData((ByteData *)0x2e21b8);
    }
    if ((local_3ee9 & 1) != 0) goto LAB_002e2331;
    local_3ee8.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_3f18);
  testing::internal::AssertHelper::AssertHelper
            (&local_3f20,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x4c9,local_3ee8.value);
  testing::internal::AssertHelper::operator=(&local_3f20,local_3f18);
  testing::internal::AssertHelper::~AssertHelper(&local_3f20);
  testing::Message::~Message((Message *)0x2e22e6);
LAB_002e2331:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3f48,&local_1450,local_1430);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_3fc9 + 0x49),
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 (allocator *)((long)local_3fc9 + 0x48));
      cfd::core::Pubkey::Pubkey(&local_3f60,(string *)(local_3fc9 + 0x49));
      in_stack_ffffffffffffbd60 = (ConfidentialTransactionContext *)local_3fc9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)((long)local_3fc9 + 1),
                 "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 (allocator *)in_stack_ffffffffffffbd60);
      cfd::core::Privkey::FromWif
                ((Privkey *)((long)local_3fc9 + 0x21),(string *)((long)local_3fc9 + 1),kTestnet,true
                );
      cfd::core::SigHashType::SigHashType(&local_3fd8);
      this_01 = (UtxoData *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                (in_stack_ffffffffffffc2b0,in_stack_ffffffffffffc2a8,
                 (Pubkey *)in_stack_ffffffffffffc2a0.ptr_,(Privkey *)in_stack_ffffffffffffc298.data_
                 ,(SigHashType *)in_stack_ffffffffffffc290,(bool)in_stack_ffffffffffffc28f,
                 in_stack_ffffffffffffc2c0,(ByteData *)in_stack_ffffffffffffc2c8);
      cfd::core::Privkey::~Privkey((Privkey *)0x2e2489);
      std::__cxx11::string::~string((string *)((long)local_3fc9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_3fc9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e24b0);
      std::__cxx11::string::~string((string *)(local_3fc9 + 0x49));
      std::allocator<char>::~allocator((allocator<char> *)((long)local_3fc9 + 0x48));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2e24d7);
    }
  }
  else {
    testing::Message::Message(&local_3fe0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4ce,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3fe8,&local_3fe0);
    testing::internal::AssertHelper::~AssertHelper(&local_3fe8);
    testing::Message::~Message((Message *)0x2e2650);
  }
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    in_stack_ffffffffffffbd5e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffbd5e) {
      cfd::core::OutPoint::OutPoint((OutPoint *)(local_4018 + 1),&local_1450,local_1430);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc290,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffc28f,in_stack_ffffffffffffc288));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2e2719);
    }
  }
  else {
    testing::Message::Message(local_4018);
    testing::internal::AssertHelper::AssertHelper
              (&local_4020,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4cf,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_4020,local_4018);
    testing::internal::AssertHelper::~AssertHelper(&local_4020);
    testing::Message::~Message((Message *)0x2e27e3);
  }
  uVar3 = testing::internal::AlwaysTrue();
  if ((bool)uVar3) {
    in_stack_ffffffffffffbd5c = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffbd5c) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffbcbc,uVar10));
      cfd::core::ByteData::operator=(&local_3ca0,&local_4038);
      cfd::core::ByteData::~ByteData((ByteData *)0x2e28a5);
    }
  }
  else {
    testing::Message::Message(&local_4040);
    testing::internal::AssertHelper::AssertHelper
              (&local_4048,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d1,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_4048,&local_4040);
    testing::internal::AssertHelper::~AssertHelper(&local_4048);
    testing::Message::~Message((Message *)0x2e296f);
  }
  AVar9 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    (in_stack_ffffffffffffbd60,
                     (ConfidentialAssetId *)
                     CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffbd5e,
                                             CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffbd5c,
                                                                     in_stack_ffffffffffffbd58)))));
  local_4080 = AVar9.amount_;
  local_4078 = AVar9.ignore_check_;
  local_4070.amount_ = local_4080;
  local_4070.ignore_check_ = (bool)local_4078;
  local_4060 = cfd::core::Amount::GetSatoshiValue(&local_4070);
  local_4088 = cfd::core::Amount::GetSatoshiValue((Amount *)&local_3938);
  testing::internal::EqHelper<false>::Compare<long,long>
            (pcVar6,(char *)this_02,(long *)CONCAT44(in_stack_ffffffffffffbcbc,uVar10),
             (long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4058);
  if (!bVar1) {
    testing::Message::Message(&local_4090);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2e2af0);
    testing::internal::AssertHelper::AssertHelper
              (&local_4098,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4098,&local_4090);
    testing::internal::AssertHelper::~AssertHelper(&local_4098);
    testing::Message::~Message((Message *)0x2e2b53);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e2bab);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_40c8,&local_3ca0);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_40a8,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000\""
             ,pcVar5,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000"
            );
  std::__cxx11::string::~string((string *)&local_40c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40a8);
  if (!bVar1) {
    testing::Message::Message(&local_40d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2e2c92);
    testing::internal::AssertHelper::AssertHelper
              (&local_40d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40d8,&local_40d0);
    testing::internal::AssertHelper::~AssertHelper(&local_40d8);
    testing::Message::~Message((Message *)0x2e2cef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e2d47);
  local_40ec = cfd::core::ConfidentialTransaction::GetVsize(local_3aa8);
  local_40f0 = 0x2f9;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar6,(char *)this_02,(uint *)CONCAT44(in_stack_ffffffffffffbcbc,uVar10),
             (int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40e8);
  if (!bVar1) {
    testing::Message::Message(&local_40f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2e2e06);
    testing::internal::AssertHelper::AssertHelper
              (&local_4100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4100,&local_40f8);
    testing::internal::AssertHelper::~AssertHelper(&local_4100);
    testing::Message::~Message((Message *)0x2e2e63);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e2ebb);
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize(local_3aa8);
  local_4104 = (uVar4 * (int)(long)((double)local_3790._40_8_ * 100.0)) / 100;
  local_411c = 0x53;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar6,(char *)this_02,(uint *)CONCAT44(in_stack_ffffffffffffbcbc,uVar10),
             (int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4118);
  if (!bVar1) {
    testing::Message::Message(&local_4128);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2e2fa2);
    testing::internal::AssertHelper::AssertHelper
              (&local_4130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_4130,&local_4128);
    testing::internal::AssertHelper::~AssertHelper(&local_4130);
    testing::Message::~Message((Message *)0x2e2fff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e3057);
  cfd::core::ByteData::~ByteData((ByteData *)0x2e3064);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2e307e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x2e30a5);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x2e30b2);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2e30bf);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e310d);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2e3175);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_AssetLimitAmountValue) {
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{2000000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = exp_dummy_asset_b;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{2000000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = exp_dummy_asset_b;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{50000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = exp_dummy_asset_a;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address1 = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");
  Address address3 = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  Address address4 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");

  ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
      address1, key.DerivePubkey(91).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
      address2, key.DerivePubkey(92).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
      address3, key.DerivePubkey(93).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr4 = ElementsConfidentialAddress(
      address4, key.DerivePubkey(94).GetPubkey());

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = exp_dummy_asset_a;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount());
  map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), reserve_ct_addr3.GetAddress());
  reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), reserve_ct_addr4.GetAddress());
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  txc.AddTxOut(reserve_ct_addr1, utxo3.amount - fee, exp_dummy_asset_a);
  txc.AddTxOut(reserve_ct_addr2, Amount(int64_t{2100000000000000}), exp_dummy_asset_b);

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000");
  EXPECT_EQ(txc.GetVsize(), 761);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(fee_rate * 100) / 100;
  EXPECT_EQ(minimum_fee, 83);
}